

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

Limit __thiscall
google::protobuf::io::CodedInputStream::PushLimit(CodedInputStream *this,int byte_limit)

{
  int iVar1;
  int iVar2;
  uint8 *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  iVar1 = this->current_limit_;
  if (-1 < byte_limit) {
    iVar2 = this->total_bytes_read_;
    uVar5 = (iVar2 - this->buffer_size_after_limit_) +
            (*(int *)&this->buffer_ - (int)this->buffer_end_);
    if ((byte_limit <= (int)(uVar5 ^ 0x7fffffff)) && (byte_limit < (int)(iVar1 - uVar5))) {
      iVar6 = uVar5 + byte_limit;
      this->current_limit_ = iVar6;
      puVar3 = this->buffer_end_ + this->buffer_size_after_limit_;
      this->buffer_end_ = puVar3;
      if (this->total_bytes_limit_ < iVar6) {
        iVar6 = this->total_bytes_limit_;
      }
      iVar4 = iVar2 - iVar6;
      if (iVar4 != 0 && iVar6 <= iVar2) {
        this->buffer_size_after_limit_ = iVar4;
        this->buffer_end_ = puVar3 + -(long)iVar4;
        return iVar1;
      }
      this->buffer_size_after_limit_ = 0;
    }
  }
  return iVar1;
}

Assistant:

CodedInputStream::Limit CodedInputStream::PushLimit(int byte_limit) {
  // Current position relative to the beginning of the stream.
  int current_position = CurrentPosition();

  Limit old_limit = current_limit_;

  // security: byte_limit is possibly evil, so check for negative values
  // and overflow. Also check that the new requested limit is before the
  // previous limit; otherwise we continue to enforce the previous limit.
  if GOOGLE_PREDICT_TRUE(byte_limit >= 0 &&
                  byte_limit <= INT_MAX - current_position &&
                  byte_limit < current_limit_ - current_position) {
    current_limit_ = current_position + byte_limit;
    RecomputeBufferLimits();
  }